

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O1

void __thiscall
wallet::CWallet::CWallet
          (CWallet *this,Chain *chain,string *name,
          unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> database)

{
  uint256 *puVar1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  base_blob<256U> *pbVar4;
  time_point tVar5;
  long in_FS_OFFSET;
  undefined1 local_3a;
  undefined1 local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_WalletStorage)._vptr_WalletStorage = (_func_int **)&PTR__CWallet_013b93c8;
  (this->super_Notifications)._vptr_Notifications = (_func_int **)&PTR__CWallet_013b9468;
  (this->vMasterKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vMasterKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->vMasterKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->vMasterKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->m_scanning_start)._M_i.__d.__r = 0;
  (this->m_scanning_progress).super___atomic_float<double>._M_fp = 0.0;
  this->nWalletVersion = 0x2904;
  tVar5 = GetDefaultNextResend();
  (this->m_next_resend).__d.__r = (rep)tVar5.__d.__r;
  this->fBroadcastTransactions = false;
  (this->m_best_block_time).super___atomic_base<long>._M_i = 0;
  (this->m_birth_time).super___atomic_base<long>._M_i = 0x7fffffffffffffff;
  SaltedOutpointHasher::SaltedOutpointHasher((SaltedOutpointHasher *)&this->mapTxSpends,false);
  (this->mapTxSpends)._M_h._M_buckets = &(this->mapTxSpends)._M_h._M_single_bucket;
  (this->mapTxSpends)._M_h._M_bucket_count = 1;
  (this->mapTxSpends)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mapTxSpends)._M_h._M_element_count = 0;
  (this->mapTxSpends)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mapTxSpends)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mapTxSpends)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i = 0;
  this->m_chain = chain;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar3 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar3,pcVar3 + name->_M_string_length);
  (this->m_database)._M_t.
  super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>._M_t.
  super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>.
  super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl =
       *(WalletDatabase **)
        database._M_t.
        super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
        .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  *(undefined8 *)
   database._M_t.
   super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>._M_t.
   super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>.
   super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl = 0;
  pbVar4 = &(this->m_last_block_processed).super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  (pbVar4->m_data)._M_elems[0x14] = '\0';
  (pbVar4->m_data)._M_elems[0x15] = '\0';
  (pbVar4->m_data)._M_elems[0x16] = '\0';
  (pbVar4->m_data)._M_elems[0x17] = '\0';
  pbVar4 = &(this->m_last_block_processed).super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x18] = '\0';
  (pbVar4->m_data)._M_elems[0x19] = '\0';
  (pbVar4->m_data)._M_elems[0x1a] = '\0';
  (pbVar4->m_data)._M_elems[0x1b] = '\0';
  (pbVar4->m_data)._M_elems[0x1c] = '\0';
  (pbVar4->m_data)._M_elems[0x1d] = '\0';
  (pbVar4->m_data)._M_elems[0x1e] = '\0';
  (pbVar4->m_data)._M_elems[0x1f] = '\0';
  puVar1 = &this->m_last_block_processed;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar4 = &(this->m_last_block_processed).super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[8] = '\0';
  (pbVar4->m_data)._M_elems[9] = '\0';
  (pbVar4->m_data)._M_elems[10] = '\0';
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  this->m_last_block_processed_height = -1;
  p_Var2 = &(this->m_external_spk_managers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_external_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_external_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_external_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_external_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_external_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  SaltedSipHasher::SaltedSipHasher((SaltedSipHasher *)&this->m_cached_spks);
  (this->m_cached_spks)._M_h._M_buckets = &(this->m_cached_spks)._M_h._M_single_bucket;
  (this->m_cached_spks)._M_h._M_bucket_count = 1;
  (this->m_cached_spks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_cached_spks)._M_h._M_element_count = 0;
  (this->m_cached_spks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined8 *)
   ((long)&(this->cs_wallet).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 0x10) = 0
  ;
  (this->cs_wallet).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.__prev
       = (__pthread_internal_list *)0x0;
  (this->m_cached_spks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_cached_spks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->cs_wallet).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->cs_wallet).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->cs_wallet).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.__next
       = (__pthread_internal_list *)0x0;
  (this->cs_wallet).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  p_Var2 = &(this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header;
  (this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->nMasterKeyMaxID = 0;
  SaltedTxidHasher::SaltedTxidHasher((SaltedTxidHasher *)&this->mapWallet);
  (this->mapWallet)._M_h._M_buckets = &(this->mapWallet)._M_h._M_single_bucket;
  (this->mapWallet)._M_h._M_bucket_count = 1;
  (this->mapWallet)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mapWallet)._M_h._M_element_count = 0;
  (this->mapWallet)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mapWallet)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mapWallet)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var2 = &(this->wtxOrdered)._M_t._M_impl.super__Rb_tree_header;
  (this->wtxOrdered)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->wtxOrdered)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->wtxOrdered)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->wtxOrdered)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  p_Var2 = &(this->m_address_book)._M_t._M_impl.super__Rb_tree_header;
  (this->m_address_book)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_address_book)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->wtxOrdered)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->nOrderPosNext = 0;
  (this->m_address_book)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_address_book)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_address_book)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->setLockedCoins)._M_t._M_impl.super__Rb_tree_header;
  (this->setLockedCoins)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->setLockedCoins)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->setLockedCoins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->setLockedCoins)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  *(undefined8 *)
   ((long)&(this->m_relock_mutex).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 0x10
   ) = 0;
  (this->m_relock_mutex).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  (this->m_relock_mutex).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  (this->m_pay_tx_fee).nSatoshisPerK = 0;
  (this->m_relock_mutex).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->m_relock_mutex).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 8) =
       0;
  (this->m_unlock_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_unlock_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->m_unlock_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_unlock_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  this->nRelockTime = 0;
  (this->m_unlock_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  (this->setLockedCoins)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_chain_notifications_handler)._M_t.
  super___uniq_ptr_impl<interfaces::Handler,_std::default_delete<interfaces::Handler>_>._M_t.
  super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>.
  super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl = (Handler *)0x0;
  (this->m_relock_mutex).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__kind =
       1;
  this->m_confirm_target = 6;
  this->m_spend_zero_conf_change = true;
  this->m_signal_rbf = true;
  this->m_allow_fallback_fee = true;
  (this->m_min_fee).nSatoshisPerK = 1000;
  (this->m_fallback_fee).nSatoshisPerK = 0;
  (this->m_discard_rate).nSatoshisPerK = 10000;
  (this->m_consolidate_feerate).nSatoshisPerK = 10000;
  this->m_max_aps_fee = 0;
  this->m_default_address_type = BECH32;
  (this->m_default_change_type).super__Optional_base<OutputType,_true,_true>._M_payload.
  super__Optional_payload_base<OutputType>._M_engaged = false;
  this->m_default_max_tx_fee = 10000000;
  this->m_keypool_size = 1000;
  (this->m_notify_tx_changed_script)._M_dataplus._M_p =
       (pointer)&(this->m_notify_tx_changed_script).field_2;
  (this->m_notify_tx_changed_script)._M_string_length = 0;
  (this->m_notify_tx_changed_script).field_2._M_local_buf[0] = '\0';
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::signal(&this->NotifyUnload,(int)&local_39,(__sighandler_t)&local_3a);
  boost::signals2::
  signal<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::signals2::mutex>
  ::signal(&this->NotifyAddressBookChanged,(int)&local_39,(__sighandler_t)&local_3a);
  boost::signals2::
  signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
  ::signal(&this->NotifyTransactionChanged,(int)&local_39,(__sighandler_t)&local_3a);
  boost::signals2::
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  ::signal(&this->ShowProgress,(int)&local_39,(__sighandler_t)&local_3a);
  boost::signals2::
  signal<void_(bool),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(bool)>,_boost::function<void_(const_boost::signals2::connection_&,_bool)>,_boost::signals2::mutex>
  ::signal(&this->NotifyWatchonlyChanged,(int)&local_39,(__sighandler_t)&local_3a);
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::signal(&this->NotifyCanGetAddressesChanged,(int)&local_39,(__sighandler_t)&local_3a);
  boost::signals2::
  signal<void_(wallet::CWallet_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(wallet::CWallet_*)>,_boost::function<void_(const_boost::signals2::connection_&,_wallet::CWallet_*)>,_boost::signals2::mutex>
  ::signal(&this->NotifyStatusChanged,(int)&local_39,(__sighandler_t)&local_3a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CWallet(interfaces::Chain* chain, const std::string& name, std::unique_ptr<WalletDatabase> database)
        : m_chain(chain),
          m_name(name),
          m_database(std::move(database))
    {
    }